

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

void __thiscall winmd::reader::CustomAttributeSig::~CustomAttributeSig(CustomAttributeSig *this)

{
  CustomAttributeSig *this_local;
  
  cppwinrt::std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::
  ~vector(&this->m_named_args);
  cppwinrt::std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
  ~vector(&this->m_fixed_args);
  return;
}

Assistant:

CustomAttributeSig(table_base const* table, byte_view& data, MethodDefSig const& ctor)
        {
            database const& db = table->get_database();
            auto const prolog = read<uint16_t>(data);
            if (prolog != 0x0001)
            {
                impl::throw_invalid("CustomAttribute blobs must start with prolog of 0x0001");
            }

            for (auto const& param : ctor.Params())
            {
                m_fixed_args.push_back(FixedArgSig{ db, param, data });
            }

            const auto num_named_args = read<uint16_t>(data);
            if (num_named_args > data.size())
            {
                impl::throw_invalid("Invalid blob array size");
            }
            m_named_args.reserve(num_named_args);

            for (uint16_t i = 0; i < num_named_args; ++i)
            {
                m_named_args.emplace_back(db, data);
            }
        }